

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall sf::Transform::getInverse(Transform *__return_storage_ptr__,Transform *this)

{
  float fVar1;
  float det;
  Transform *this_local;
  
  fVar1 = this->m_matrix[3] *
          (this->m_matrix[0xd] * this->m_matrix[4] + -(this->m_matrix[5] * this->m_matrix[0xc])) +
          this->m_matrix[0] *
          (this->m_matrix[0xf] * this->m_matrix[5] + -(this->m_matrix[7] * this->m_matrix[0xd])) +
          -(this->m_matrix[1] *
           (this->m_matrix[0xf] * this->m_matrix[4] + -(this->m_matrix[7] * this->m_matrix[0xc])));
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    Transform(__return_storage_ptr__,
              (this->m_matrix[0xf] * this->m_matrix[5] + -(this->m_matrix[7] * this->m_matrix[0xd]))
              / fVar1,-(this->m_matrix[0xf] * this->m_matrix[4] +
                       -(this->m_matrix[7] * this->m_matrix[0xc])) / fVar1,
              (this->m_matrix[0xd] * this->m_matrix[4] + -(this->m_matrix[5] * this->m_matrix[0xc]))
              / fVar1,-(this->m_matrix[0xf] * this->m_matrix[1] +
                       -(this->m_matrix[3] * this->m_matrix[0xd])) / fVar1,
              (this->m_matrix[0xf] * this->m_matrix[0] + -(this->m_matrix[3] * this->m_matrix[0xc]))
              / fVar1,-(this->m_matrix[0xd] * this->m_matrix[0] +
                       -(this->m_matrix[1] * this->m_matrix[0xc])) / fVar1,
              (this->m_matrix[7] * this->m_matrix[1] + -(this->m_matrix[3] * this->m_matrix[5])) /
              fVar1,-(this->m_matrix[7] * this->m_matrix[0] +
                     -(this->m_matrix[3] * this->m_matrix[4])) / fVar1,
              (this->m_matrix[5] * this->m_matrix[0] + -(this->m_matrix[1] * this->m_matrix[4])) /
              fVar1);
  }
  else {
    memcpy(__return_storage_ptr__,Identity,0x40);
  }
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::getInverse() const
{
    // Compute the determinant
    float det = m_matrix[0] * (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) -
                m_matrix[1] * (m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) +
                m_matrix[3] * (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]);

    // Compute the inverse if the determinant is not zero
    // (don't use an epsilon because the determinant may *really* be tiny)
    if (det != 0.f)
    {
        return Transform( (m_matrix[15] * m_matrix[5] - m_matrix[7] * m_matrix[13]) / det,
                         -(m_matrix[15] * m_matrix[4] - m_matrix[7] * m_matrix[12]) / det,
                          (m_matrix[13] * m_matrix[4] - m_matrix[5] * m_matrix[12]) / det,
                         -(m_matrix[15] * m_matrix[1] - m_matrix[3] * m_matrix[13]) / det,
                          (m_matrix[15] * m_matrix[0] - m_matrix[3] * m_matrix[12]) / det,
                         -(m_matrix[13] * m_matrix[0] - m_matrix[1] * m_matrix[12]) / det,
                          (m_matrix[7]  * m_matrix[1] - m_matrix[3] * m_matrix[5])  / det,
                         -(m_matrix[7]  * m_matrix[0] - m_matrix[3] * m_matrix[4])  / det,
                          (m_matrix[5]  * m_matrix[0] - m_matrix[1] * m_matrix[4])  / det);
    }
    else
    {
        return Identity;
    }
}